

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

char * wasm::getExpressionName(Expression *curr)

{
  uint uVar1;
  
  uVar1 = curr->_id - BlockId;
  if (uVar1 < 0x55) {
    return &DAT_00bdf6d8 + *(int *)(&DAT_00bdf6d8 + (ulong)uVar1 * 4);
  }
  handle_unreachable("invalid id",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                     ,0x72);
}

Assistant:

const char* getExpressionName(Expression* curr) {
  switch (curr->_id) {

#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return #CLASS_TO_VISIT;

#include "wasm-delegations.def"

    default:
      WASM_UNREACHABLE("invalid id");
  }
}